

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DES.cpp
# Opt level: O3

SequenceD<64> * __thiscall
DESinv::operator()(SequenceD<64> *__return_storage_ptr__,DESinv *this,SequenceD<64> *seq)

{
  Sequence *seq_00;
  deque<int,_std::allocator<int>_> *this_00;
  deque<int,_std::allocator<int>_> *this_01;
  int iVar1;
  Sequence tempSeq;
  SequenceD<64> swapSeq;
  SequenceD<64> tmp;
  Sequence xorSeq;
  Finv f_inv;
  Sequence local_378;
  Sequence local_320;
  SequenceD<64> local_2c8;
  SequenceD<64> local_218;
  Sequence local_168;
  Finv local_110;
  
  Finv::Finv(&local_110,&this->m_key);
  Permutation<64,_64>::operator()
            (&local_218,(Permutation<64,_64> *)&local_2c8,seq,&INITIAL_PERMUTATION);
  seq_00 = &local_218.m_other;
  this_00 = &local_2c8.super_Sequence.m_bits;
  this_01 = &local_2c8.m_other.m_bits;
  iVar1 = 0x10;
  do {
    Finv::operator()(&local_320,&local_110,seq_00);
    local_378._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
    std::deque<int,_std::allocator<int>_>::deque(&local_378.m_bits,&local_320.m_bits);
    Sequence::operator*(&local_168,&local_218.super_Sequence,&local_378);
    local_378._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
    std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
              (&local_378.m_bits.super__Deque_base<int,_std::allocator<int>_>);
    SequenceD<64>::SequenceD(&local_2c8,seq_00,&local_168);
    std::deque<int,_std::allocator<int>_>::operator=(&local_218.super_Sequence.m_bits,this_00);
    std::deque<int,_std::allocator<int>_>::operator=(&local_218.m_other.m_bits,this_01);
    local_2c8.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00115cc8;
    local_2c8.m_other._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
    std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
              (&this_01->super__Deque_base<int,_std::allocator<int>_>);
    local_2c8.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
    std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
              (&this_00->super__Deque_base<int,_std::allocator<int>_>);
    local_168._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
    std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
              (&local_168.m_bits.super__Deque_base<int,_std::allocator<int>_>);
    local_320._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
    std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
              (&local_320.m_bits.super__Deque_base<int,_std::allocator<int>_>);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  SequenceD<64>::SequenceD(&local_2c8,seq_00,&local_218.super_Sequence);
  Permutation<64,_64>::operator()
            (__return_storage_ptr__,(Permutation<64,_64> *)&local_320,&local_2c8,
             &INITIAL_PERMUTATION_REVERSE);
  local_2c8.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00115cc8;
  local_2c8.m_other._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&local_2c8.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>);
  local_2c8.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&local_2c8.super_Sequence.m_bits.super__Deque_base<int,_std::allocator<int>_>);
  local_218.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00115cc8;
  local_218.m_other._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&local_218.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>);
  local_218.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&local_218.super_Sequence.m_bits.super__Deque_base<int,_std::allocator<int>_>);
  std::vector<SequenceD<48>,_std::allocator<SequenceD<48>_>_>::~vector(&local_110.m_keys);
  S_function::~S_function(&local_110.m_sFunction);
  local_110.m_keyGen.m_rolling.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00115d30;
  local_110.m_keyGen.m_rolling.m_other._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&local_110.m_keyGen.m_rolling.m_other.m_bits.
              super__Deque_base<int,_std::allocator<int>_>);
  local_110.m_keyGen.m_rolling.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&local_110.m_keyGen.m_rolling.super_Sequence.m_bits.
              super__Deque_base<int,_std::allocator<int>_>);
  return __return_storage_ptr__;
}

Assistant:

SequenceD<64> DESinv::operator()(SequenceD<64> seq) {
    Finv f_inv(m_key);
    auto tmp = Permutation<64, 64>{}(seq, INITIAL_PERMUTATION);

    for (int i = 0; i < 16; ++i) {
        auto tempSeq = f_inv(tmp.right());
        auto xorSeq = tmp.left() * tempSeq;
        tmp = SequenceD<64>{tmp.right(), xorSeq};
    }

    auto swapSeq = SequenceD<64>{tmp.right(), tmp.left()};
    return Permutation<64, 64>()(swapSeq, INITIAL_PERMUTATION_REVERSE);
}